

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsUniformBlockCase.cpp
# Opt level: O0

void deqp::gls::ub::anon_unknown_12::getGLUniformLayout
               (Functions *gl,UniformLayout *layout,deUint32 program)

{
  allocator<unsigned_int> *this;
  allocator<int> *paVar1;
  int iVar2;
  pointer pBVar3;
  pointer pUVar4;
  value_type vVar5;
  deUint32 dVar6;
  int iVar7;
  DataType DVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  TestError *this_00;
  deUint32 *pdVar13;
  int local_210;
  allocator<char> local_209;
  string local_208 [32];
  int local_1e8;
  int local_1e4;
  deUint32 type;
  int size_1;
  GLsizei nameLen_1;
  vector<char,_std::allocator<char>_> nameBuf_1;
  UniformLayoutEntry *entry_1;
  int uniformNdx;
  vector<int,_std::allocator<int>_> rowMajorFlags;
  undefined1 local_190 [8];
  vector<int,_std::allocator<int>_> matrixStrides;
  undefined1 local_170 [8];
  vector<int,_std::allocator<int>_> arrayStrides;
  undefined1 local_150 [8];
  vector<int,_std::allocator<int>_> offsets;
  undefined1 local_130 [8];
  vector<int,_std::allocator<int>_> blockIndices;
  undefined1 local_110 [8];
  vector<int,_std::allocator<int>_> nameLengths;
  undefined1 local_f0 [8];
  vector<int,_std::allocator<int>_> sizes;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> types;
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> uniformIndices;
  string local_90 [55];
  allocator_type local_59;
  undefined1 local_58 [8];
  vector<char,_std::allocator<char>_> nameBuf;
  int local_38;
  int numBlockUniforms;
  int nameLen;
  int size;
  BlockLayoutEntry *entry;
  int blockNdx;
  int numActiveBlocks;
  int numActiveUniforms;
  deUint32 program_local;
  UniformLayout *layout_local;
  Functions *gl_local;
  
  blockNdx = 0;
  entry._4_4_ = 0;
  numActiveBlocks = program;
  _numActiveUniforms = layout;
  layout_local = (UniformLayout *)gl;
  (*gl->getProgramiv)(program,0x8b86,&blockNdx);
  (*(code *)layout_local[0x34].uniforms.
            super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
            ._M_impl.super__Vector_impl_data._M_start)(numActiveBlocks,0x8a36,(long)&entry + 4);
  dVar6 = (*(code *)layout_local[0x2a].uniforms.
                    super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                    ._M_impl.super__Vector_impl_data._M_finish)();
  glu::checkError(dVar6,"Failed to get number of uniforms and uniform blocks",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                  ,0x497);
  std::vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>::
  resize(&_numActiveUniforms->blocks,(long)entry._4_4_);
  for (entry._0_4_ = 0; (int)entry < entry._4_4_; entry._0_4_ = (int)entry + 1) {
    _nameLen = std::
               vector<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ::operator[](&_numActiveUniforms->blocks,(long)(int)entry);
    (*(code *)layout_local[0x27].blocks.
              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)
              (numActiveBlocks,(int)entry,0x8a40,&numBlockUniforms);
    (*(code *)layout_local[0x27].blocks.
              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)
              (numActiveBlocks,(int)entry,0x8a41,&local_38);
    (*(code *)layout_local[0x27].blocks.
              super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage)
              (numActiveBlocks,(int)entry,0x8a42,
               &nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14);
    dVar6 = (*(code *)layout_local[0x2a].uniforms.
                      super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar6,"Uniform block query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                    ,0x4a6);
    if (local_38 < 1) {
      local_210 = 1;
    }
    else {
      local_210 = local_38;
    }
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)local_58,(long)local_210,&local_59);
    std::allocator<char>::~allocator(&local_59);
    iVar7 = numActiveBlocks;
    iVar2 = (int)entry;
    pBVar3 = layout_local[0x27].blocks.
             super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<char,_std::allocator<char>_>::size
                      ((vector<char,_std::allocator<char>_> *)local_58);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_58,0);
    (*(code *)pBVar3)(iVar7,iVar2,sVar9 & 0xffffffff,0,pvVar10);
    pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                        ((vector<char,_std::allocator<char>_> *)local_58,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_90,pvVar10,
               (allocator<char> *)
               ((long)&uniformIndices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    std::__cxx11::string::operator=((string *)_nameLen,local_90);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&uniformIndices.
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    _nameLen->size = numBlockUniforms;
    std::vector<int,_std::allocator<int>_>::resize
              (&_nameLen->activeUniformIndices,
               (long)(int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_);
    iVar7 = numActiveBlocks;
    iVar2 = (int)entry;
    if (0 < (int)nameBuf.super__Vector_base<char,_std::allocator<char>_>._M_impl._20_4_) {
      pBVar3 = layout_local[0x27].blocks.
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          (&_nameLen->activeUniformIndices,0);
      (*(code *)pBVar3)(iVar7,iVar2,0x8a43,pvVar11);
    }
    dVar6 = (*(code *)layout_local[0x2a].uniforms.
                      super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar6,"Uniform block query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                    ,0x4b3);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)local_58);
  }
  if (0 < blockNdx) {
    sVar9 = (size_type)blockNdx;
    this = (allocator<unsigned_int> *)
           ((long)&types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<unsigned_int>::allocator(this);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,sVar9,this);
    std::allocator<unsigned_int>::~allocator
              ((allocator<unsigned_int> *)
               ((long)&types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    for (types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 0;
        vVar5 = (value_type)
                types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage,
        (int)(value_type)
             types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage < blockNdx;
        types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (value_type)
             types.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage + 1) {
      pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,
                           (long)(int)(value_type)
                                      types.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage);
      *pvVar12 = vVar5;
    }
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_d0,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&sizes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&nameLengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_f0,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&nameLengths.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_110,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&blockIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_130,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&offsets.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&arrayStrides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_150,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&arrayStrides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&matrixStrides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_170,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&matrixStrides.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    paVar1 = (allocator<int> *)
             ((long)&rowMajorFlags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_190,sVar9,paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&rowMajorFlags.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 7));
    sVar9 = (size_type)blockNdx;
    std::allocator<int>::allocator((allocator<int> *)((long)&entry_1 + 7));
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&uniformNdx,sVar9,
               (allocator<int> *)((long)&entry_1 + 7));
    std::allocator<int>::~allocator((allocator<int> *)((long)&entry_1 + 7));
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_d0,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a37,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_f0,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a38,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_110,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a39,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_130,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a3a,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_150,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a3b,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_170,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a3c,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)local_190,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a3d,pvVar11);
    iVar2 = numActiveBlocks;
    pUVar4 = layout_local[0x27].uniforms.
             super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    sVar9 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i,0);
    pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&uniformNdx,0);
    (*(code *)pUVar4)(iVar2,sVar9 & 0xffffffff,pvVar12,0x8a3e,pvVar11);
    dVar6 = (*(code *)layout_local[0x2a].uniforms.
                      super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
    glu::checkError(dVar6,"Active uniform query failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                    ,0x4d0);
    std::
    vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>::
    resize(&_numActiveUniforms->uniforms,(long)blockNdx);
    for (entry_1._0_4_ = 0; (int)entry_1 < blockNdx; entry_1._0_4_ = (int)entry_1 + 1) {
      nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
           std::
           vector<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
           ::operator[](&_numActiveUniforms->uniforms,(long)(int)entry_1);
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_110,(long)(int)entry_1);
      iVar2 = *pvVar11;
      std::allocator<char>::allocator();
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&nameLen_1,(long)iVar2,
                 (allocator_type *)((long)&size_1 + 3));
      std::allocator<char>::~allocator((allocator<char> *)((long)&size_1 + 3));
      iVar7 = numActiveBlocks;
      iVar2 = (int)entry_1;
      type = 0;
      local_1e4 = 0;
      local_1e8 = 0;
      pBVar3 = layout_local[0x27].blocks.
               super__Vector_base<deqp::gls::ub::BlockLayoutEntry,_std::allocator<deqp::gls::ub::BlockLayoutEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar9 = std::vector<char,_std::allocator<char>_>::size
                        ((vector<char,_std::allocator<char>_> *)&nameLen_1);
      pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&nameLen_1,0);
      (*(code *)pBVar3)(iVar7,iVar2,sVar9 & 0xffffffff,&type,&local_1e4,&local_1e8,pvVar10);
      dVar6 = (*(code *)layout_local[0x2a].uniforms.
                        super__Vector_base<deqp::gls::ub::UniformLayoutEntry,_std::allocator<deqp::gls::ub::UniformLayoutEntry>_>
                        ._M_impl.super__Vector_impl_data._M_finish)();
      glu::checkError(dVar6,"Uniform name query failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                      ,0x4de);
      iVar7 = type + 1;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_110,(long)(int)entry_1);
      iVar2 = local_1e4;
      if (iVar7 != *pvVar11) {
LAB_00f600a4:
        this_00 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_00,
                   "Values returned by glGetActiveUniform() don\'t match with values queried with glGetActiveUniformsiv()."
                   ,(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsUniformBlockCase.cpp"
                   ,0x4e4);
        __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_f0,(long)(int)entry_1);
      iVar7 = local_1e8;
      if (iVar2 != *pvVar11) goto LAB_00f600a4;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_d0,(long)(int)entry_1);
      if (iVar7 != *pvVar11) goto LAB_00f600a4;
      pvVar10 = std::vector<char,_std::allocator<char>_>::operator[]
                          ((vector<char,_std::allocator<char>_> *)&nameLen_1,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_208,pvVar10,&local_209);
      std::__cxx11::string::operator=
                ((string *)nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_,
                 local_208);
      std::__cxx11::string::~string(local_208);
      std::allocator<char>::~allocator(&local_209);
      pdVar13 = (deUint32 *)
                std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_d0,(long)(int)entry_1);
      DVar8 = glu::getDataTypeFromGLType(*pdVar13);
      *(DataType *)(nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x20)
           = DVar8;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_f0,(long)(int)entry_1);
      *(value_type *)
       (nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x24) = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_130,(long)(int)entry_1);
      *(value_type *)
       (nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x28) = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_150,(long)(int)entry_1);
      *(value_type *)
       (nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x2c) = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_170,(long)(int)entry_1);
      *(value_type *)
       (nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x30) = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)local_190,(long)(int)entry_1);
      *(value_type *)
       (nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x34) = *pvVar11;
      pvVar11 = std::vector<int,_std::allocator<int>_>::operator[]
                          ((vector<int,_std::allocator<int>_> *)&uniformNdx,(long)(int)entry_1);
      *(bool *)(nameBuf_1.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 0x38) =
           *pvVar11 != 0;
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)&nameLen_1);
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&uniformNdx);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_190);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_170);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_150);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_130);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_110);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_f0);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&i);
  }
  return;
}

Assistant:

void getGLUniformLayout (const glw::Functions& gl, UniformLayout& layout, deUint32 program)
{
	int		numActiveUniforms	= 0;
	int		numActiveBlocks		= 0;

	gl.getProgramiv(program, GL_ACTIVE_UNIFORMS,		&numActiveUniforms);
	gl.getProgramiv(program, GL_ACTIVE_UNIFORM_BLOCKS,	&numActiveBlocks);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to get number of uniforms and uniform blocks");

	// Block entries.
	layout.blocks.resize(numActiveBlocks);
	for (int blockNdx = 0; blockNdx < numActiveBlocks; blockNdx++)
	{
		BlockLayoutEntry&	entry				= layout.blocks[blockNdx];
		int					size;
		int					nameLen;
		int					numBlockUniforms;

		gl.getActiveUniformBlockiv(program, (deUint32)blockNdx, GL_UNIFORM_BLOCK_DATA_SIZE,			&size);
		gl.getActiveUniformBlockiv(program, (deUint32)blockNdx, GL_UNIFORM_BLOCK_NAME_LENGTH,		&nameLen);
		gl.getActiveUniformBlockiv(program, (deUint32)blockNdx, GL_UNIFORM_BLOCK_ACTIVE_UNIFORMS,	&numBlockUniforms);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform block query failed");

		// \note Some implementations incorrectly return 0 as name length even though the length should include null terminator.
		std::vector<char> nameBuf(nameLen > 0 ? nameLen : 1);
		gl.getActiveUniformBlockName(program, (deUint32)blockNdx, (glw::GLsizei)nameBuf.size(), DE_NULL, &nameBuf[0]);

		entry.name	= std::string(&nameBuf[0]);
		entry.size	= size;
		entry.activeUniformIndices.resize(numBlockUniforms);

		if (numBlockUniforms > 0)
			gl.getActiveUniformBlockiv(program, (deUint32)blockNdx, GL_UNIFORM_BLOCK_ACTIVE_UNIFORM_INDICES, &entry.activeUniformIndices[0]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform block query failed");
	}

	if (numActiveUniforms > 0)
	{
		// Uniform entries.
		std::vector<deUint32> uniformIndices(numActiveUniforms);
		for (int i = 0; i < numActiveUniforms; i++)
			uniformIndices[i] = (deUint32)i;

		std::vector<int>		types			(numActiveUniforms);
		std::vector<int>		sizes			(numActiveUniforms);
		std::vector<int>		nameLengths		(numActiveUniforms);
		std::vector<int>		blockIndices	(numActiveUniforms);
		std::vector<int>		offsets			(numActiveUniforms);
		std::vector<int>		arrayStrides	(numActiveUniforms);
		std::vector<int>		matrixStrides	(numActiveUniforms);
		std::vector<int>		rowMajorFlags	(numActiveUniforms);

		// Execute queries.
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_TYPE,			&types[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_SIZE,			&sizes[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_NAME_LENGTH,	&nameLengths[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_BLOCK_INDEX,	&blockIndices[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_OFFSET,			&offsets[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_ARRAY_STRIDE,	&arrayStrides[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_MATRIX_STRIDE,	&matrixStrides[0]);
		gl.getActiveUniformsiv(program, (glw::GLsizei)uniformIndices.size(), &uniformIndices[0], GL_UNIFORM_IS_ROW_MAJOR,	&rowMajorFlags[0]);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Active uniform query failed");

		// Translate to LayoutEntries
		layout.uniforms.resize(numActiveUniforms);
		for (int uniformNdx = 0; uniformNdx < numActiveUniforms; uniformNdx++)
		{
			UniformLayoutEntry&	entry		= layout.uniforms[uniformNdx];
			std::vector<char>	nameBuf		(nameLengths[uniformNdx]);
			glw::GLsizei		nameLen		= 0;
			int					size		= 0;
			deUint32			type		= GL_NONE;

			gl.getActiveUniform(program, (deUint32)uniformNdx, (glw::GLsizei)nameBuf.size(), &nameLen, &size, &type, &nameBuf[0]);

			GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform name query failed");

			// \note glGetActiveUniform() returns length without \0 and glGetActiveUniformsiv() with \0
			if (nameLen+1	!= nameLengths[uniformNdx]	||
				size		!= sizes[uniformNdx]		||
				type		!= (deUint32)types[uniformNdx])
				TCU_FAIL("Values returned by glGetActiveUniform() don't match with values queried with glGetActiveUniformsiv().");

			entry.name			= std::string(&nameBuf[0]);
			entry.type			= glu::getDataTypeFromGLType(types[uniformNdx]);
			entry.size			= sizes[uniformNdx];
			entry.blockNdx		= blockIndices[uniformNdx];
			entry.offset		= offsets[uniformNdx];
			entry.arrayStride	= arrayStrides[uniformNdx];
			entry.matrixStride	= matrixStrides[uniformNdx];
			entry.isRowMajor	= rowMajorFlags[uniformNdx] != GL_FALSE;
		}
	}
}